

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

int mxx::exscan<int,mxx::min<int>>(undefined8 x,comm *param_2,byte param_3)

{
  int iVar1;
  MPI_Datatype poVar2;
  MPI_Op poVar3;
  MPI_Comm poVar4;
  int local_70 [2];
  int result;
  custom_op<int> op;
  bool commutative_local;
  comm *comm_local;
  int *x_local;
  
  op.m_op._7_1_ = param_3 & 1;
  custom_op<int>::custom_op<mxx::min<int>>((custom_op<int> *)&result,op.m_op._7_1_);
  poVar2 = custom_op<int>::get_type((custom_op<int> *)&result);
  poVar3 = custom_op<int>::get_op((custom_op<int> *)&result);
  poVar4 = comm::operator_cast_to_ompi_communicator_t_(param_2);
  MPI_Exscan(x,local_70,1,poVar2,poVar3,poVar4);
  iVar1 = comm::rank(param_2);
  if (iVar1 == 0) {
    local_70[0] = 0;
  }
  iVar1 = local_70[0];
  custom_op<int>::~custom_op((custom_op<int> *)&result);
  return iVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm(), const bool commutative = true) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func), commutative);
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}